

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O1

size_t singleOptionUsage(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  uint uVar1;
  char *__s;
  ushort **ppuVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  int __c;
  byte bVar9;
  mbstate_t t;
  mbstate_t local_40;
  char *local_38;
  
  __s = getArgDescrip(opt,(char *)columns);
  ppuVar2 = __ctype_b_loc();
  lVar8 = 5;
  bVar9 = (*(byte *)((long)*ppuVar2 + (long)opt->shortName * 2 + 1) & 0x40) >> 6 &
          (long)opt->shortName != 0x20;
  if ((bVar9 == 0) && (lVar8 = 3, opt->longName == (char *)0x0)) {
    sVar5 = columns->cur;
  }
  else {
    if (opt->longName != (char *)0x0) {
      uVar1 = opt->argInfo;
      sVar3 = strlen(opt->longName);
      lVar8 = lVar8 + sVar3 + (ulong)bVar9 + (ulong)(-1 < (int)uVar1) + 1;
    }
    if (__s != (char *)0x0) {
      pvVar4 = memchr(" =(",(int)*__s,4);
      local_38 = __s;
      sVar3 = strlen(__s);
      local_40.__count = 0;
      local_40.__value = (_union_27)0x0;
      sVar3 = mbsrtowcs((wchar_t *)0x0,&local_38,sVar3,&local_40);
      lVar8 = lVar8 + sVar3 + (ulong)(pvVar4 == (void *)0x0);
    }
    if (columns->max < columns->cur + lVar8) {
      fwrite("\n       ",8,1,(FILE *)fp);
      columns->cur = 7;
    }
    fwrite(" [",2,1,(FILE *)fp);
    if (bVar9 != 0) {
      fprintf((FILE *)fp,"-%c",(ulong)(uint)(int)opt->shortName);
    }
    if (opt->longName != (char *)0x0) {
      pcVar7 = "";
      if (bVar9 != 0) {
        pcVar7 = "|";
      }
      pcVar6 = "-";
      if (-1 < (int)opt->argInfo) {
        pcVar6 = "--";
      }
      fprintf((FILE *)fp,"%s%s%s",pcVar7,pcVar6);
    }
    if (__s != (char *)0x0) {
      pvVar4 = memchr(" =(",(int)*__s,4);
      if (pvVar4 == (void *)0x0) {
        __c = 0x3d;
        if (opt->longName == (char *)0x0) {
          __c = 0x20;
        }
        fputc(__c,(FILE *)fp);
      }
      fputs(__s,(FILE *)fp);
    }
    fputc(0x5d,(FILE *)fp);
    sVar5 = columns->cur + lVar8 + 1;
  }
  return sVar5;
}

Assistant:

static size_t singleOptionUsage(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char *translation_domain)
{
    size_t len = sizeof(" []")-1;
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	return columns->cur;

    len = sizeof(" []")-1;
    if (prtshort)
	len += sizeof("-c")-1;
    if (prtlong) {
	if (prtshort) len += sizeof("|")-1;
	len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
	len += strlen(opt->longName);
    }

    if (argDescrip) {

	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

	/* Adjust for (possible) wide characters. */
	len += stringDisplayWidth(argDescrip);
    }

    if ((columns->cur + len) > columns->max) {
	fprintf(fp, "\n       ");
	columns->cur = (size_t)7;
    } 

    fprintf(fp, " [");
    if (prtshort)
	fprintf(fp, "-%c", opt->shortName);
    if (prtlong)
	fprintf(fp, "%s%s%s",
		(prtshort ? "|" : ""),
		(F_ISSET(opt, ONEDASH) ? "-" : "--"),
		opt->longName);
#undef	prtlong

    if (argDescrip) {
	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) fputc(opt->longName == NULL ? ' ' : '=', fp);
	fprintf(fp, "%s", argDescrip);
    }
    fprintf(fp, "]");

    return columns->cur + len + 1;
}